

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O0

cgltf_float cgltf_json_to_float(jsmntok_t *tok,uint8_t *json_chunk)

{
  double dVar1;
  int local_b0;
  char local_a8 [4];
  int size;
  char tmp [128];
  uint8_t *json_chunk_local;
  jsmntok_t *tok_local;
  
  if (tok->type == JSMN_PRIMITIVE) {
    if ((uint)(tok->end - tok->start) < 0x80) {
      local_b0 = tok->end - tok->start;
    }
    else {
      local_b0 = 0x7f;
    }
    strncpy(local_a8,(char *)(json_chunk + tok->start),(long)local_b0);
    local_a8[local_b0] = '\0';
    dVar1 = atof(local_a8);
    tok_local._4_4_ = (float)dVar1;
  }
  else {
    tok_local._4_4_ = -1.0;
  }
  return tok_local._4_4_;
}

Assistant:

static cgltf_float cgltf_json_to_float(jsmntok_t const* tok, const uint8_t* json_chunk)
{
	CGLTF_CHECK_TOKTYPE(*tok, JSMN_PRIMITIVE);
	char tmp[128];
	int size = (cgltf_size)(tok->end - tok->start) < sizeof(tmp) ? tok->end - tok->start : (int)(sizeof(tmp) - 1);
	strncpy(tmp, (const char*)json_chunk + tok->start, size);
	tmp[size] = 0;
	return (cgltf_float)CGLTF_ATOF(tmp);
}